

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_input.hpp
# Opt level: O1

void __thiscall
tao::pegtl::internal::mmap_holder::mmap_holder<char_const*&>(mmap_holder *this,char **in_filename)

{
  allocator local_11;
  
  std::__cxx11::string::string((string *)this,*in_filename,&local_11);
  file_mapper::file_mapper(&this->data,(this->filename)._M_dataplus._M_p);
  return;
}

Assistant:

explicit mmap_holder( T&& in_filename )
               : filename( std::forward< T >( in_filename ) ),
                 data( filename.c_str() )
            {
            }